

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall
IlmThread_2_5::anon_unknown_5::DefaultThreadPoolProvider::DefaultThreadPoolProvider
          (DefaultThreadPoolProvider *this,int count)

{
  uint in_ESI;
  ThreadPoolProvider *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  ThreadPoolProvider::ThreadPoolProvider(in_RDI);
  in_RDI->_vptr_ThreadPoolProvider = (_func_int **)&PTR__DefaultThreadPoolProvider_00111cc8;
  DefaultWorkData::DefaultWorkData((DefaultWorkData *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  (*in_RDI->_vptr_ThreadPoolProvider[3])(in_RDI,(ulong)in_ESI);
  return;
}

Assistant:

DefaultThreadPoolProvider::DefaultThreadPoolProvider (int count)
{
    setNumThreads(count);
}